

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O1

CharClass<char> * __thiscall
Centaurus::CharClass<char>::operator|
          (CharClass<char> *__return_storage_ptr__,CharClass<char> *this,Range<char> *r)

{
  vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_> *this_00;
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  pointer pRVar5;
  pointer pRVar6;
  pointer pRVar7;
  
  __return_storage_ptr__->_vptr_CharClass = (_func_int **)&PTR__CharClass_001a7030;
  this_00 = &__return_storage_ptr__->m_ranges;
  (__return_storage_ptr__->m_ranges).
  super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->m_ranges).
  super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->m_ranges).
  super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pRVar5 = (this->m_ranges).
           super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pRVar6 = (this->m_ranges).
           super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pRVar7 = pRVar5;
  if (pRVar5 != pRVar6) {
    do {
      if (((byte)pRVar7->m_start <= (byte)r->m_end) && ((byte)r->m_start <= (byte)pRVar7->m_end))
      break;
      pRVar7 = pRVar7 + 1;
    } while (pRVar7 != pRVar6);
  }
  std::vector<Centaurus::Range<char>,std::allocator<Centaurus::Range<char>>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<Centaurus::Range<char>const*,std::vector<Centaurus::Range<char>,std::allocator<Centaurus::Range<char>>>>>
            ((vector<Centaurus::Range<char>,std::allocator<Centaurus::Range<char>>> *)this_00,
             (__return_storage_ptr__->m_ranges).
             super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>.
             _M_impl.super__Vector_impl_data._M_finish,pRVar5,pRVar7);
  for (; pRVar7 != (this->m_ranges).
                   super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish; pRVar7 = pRVar7 + 1) {
    bVar1 = pRVar7->m_start;
    bVar2 = r->m_end;
    if (bVar2 < bVar1) break;
    bVar3 = pRVar7->m_end;
    bVar4 = r->m_start;
    if (bVar3 < bVar4) break;
    if (bVar1 < bVar4) {
      bVar4 = bVar1;
    }
    if (bVar3 < bVar2) {
      bVar3 = bVar2;
    }
    r->m_start = bVar4;
    r->m_end = bVar3;
  }
  std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::push_back
            (this_00,r);
  std::vector<Centaurus::Range<char>,std::allocator<Centaurus::Range<char>>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<Centaurus::Range<char>const*,std::vector<Centaurus::Range<char>,std::allocator<Centaurus::Range<char>>>>>
            ((vector<Centaurus::Range<char>,std::allocator<Centaurus::Range<char>>> *)this_00,
             (__return_storage_ptr__->m_ranges).
             super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>.
             _M_impl.super__Vector_impl_data._M_finish,pRVar7,
             (this->m_ranges).
             super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  return __return_storage_ptr__;
}

Assistant:

CharClass<TCHAR> operator|(Range<TCHAR> r) const
    {
        CharClass<TCHAR> cc;

        auto i = m_ranges.cbegin();

        for (; i != m_ranges.cend() && !i->overlaps(r); i++)
            ;
        
        cc.m_ranges.insert(cc.m_ranges.end(), m_ranges.cbegin(), i);

        for (; i != m_ranges.cend() && i->overlaps(r); i++)
        {
            r = r.merge(*i);
        }

        cc.m_ranges.push_back(r);

        cc.m_ranges.insert(cc.m_ranges.end(), i, m_ranges.cend());

        return cc;
    }